

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
ON_Mesh::InvalidateCachedTextureCoordinates
          (ON_Mesh *this,bool bOnlyInvalidateCachedSurfaceParameterMapping)

{
  ON_TextureCoordinates *pOVar1;
  int local_18;
  int i;
  bool bOnlyInvalidateCachedSurfaceParameterMapping_local;
  ON_Mesh *this_local;
  
  if (bOnlyInvalidateCachedSurfaceParameterMapping) {
    local_18 = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC);
    while (local_18 = local_18 + -1, -1 < local_18) {
      pOVar1 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,local_18);
      if ((pOVar1->m_tag).m_mapping_type == srfp_mapping) {
        ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,local_18);
      }
    }
  }
  else {
    ON_ClassArray<ON_TextureCoordinates>::Destroy(&this->m_TC);
  }
  return;
}

Assistant:

void ON_Mesh::InvalidateCachedTextureCoordinates(bool bOnlyInvalidateCachedSurfaceParameterMapping)
{
  if (bOnlyInvalidateCachedSurfaceParameterMapping)
  {
    for (int i = m_TC.Count() - 1; i >= 0; i--)
    {
      if (m_TC[i].m_tag.m_mapping_type == ON_TextureMapping::TYPE::srfp_mapping)
      {
        m_TC.Remove(i);
      }
    }
  }
  else
  {
    m_TC.Destroy();
  }
}